

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm_compiled.cpp
# Opt level: O0

void __thiscall
randomx::CompiledVm<randomx::AlignedAllocator<64UL>,_false,_true>::run
          (CompiledVm<randomx::AlignedAllocator<64UL>,_false,_true> *this,void *seed)

{
  ProgramConfiguration *in_RSI;
  Program *in_RDI;
  JitCompilerX86 *unaff_retaddr;
  randomx_vm *in_stack_00000040;
  Program *prog;
  
  prog = in_RDI;
  VmBase<randomx::AlignedAllocator<64UL>,_false>::generateProgram
            ((VmBase<randomx::AlignedAllocator<64UL>,_false> *)in_RSI,in_RDI);
  randomx_vm::initialize(in_stack_00000040);
  JitCompilerX86::enableWriting((JitCompilerX86 *)0x124eea);
  JitCompilerX86::generateProgram(unaff_retaddr,prog,in_RSI);
  JitCompilerX86::enableExecution((JitCompilerX86 *)0x124f1b);
  in_RDI[1].programBuffer[0x1d] =
       (Instruction)(*(long *)in_RDI[1].programBuffer[0x1f] + (long)in_RDI[1].programBuffer[0x20]);
  execute((CompiledVm<randomx::AlignedAllocator<64UL>,_false,_true> *)in_RSI);
  return;
}

Assistant:

void CompiledVm<Allocator, softAes, secureJit>::run(void* seed) {
		VmBase<Allocator, softAes>::generateProgram(seed);
		randomx_vm::initialize();
		if (secureJit) {
			compiler.enableWriting();
		}
		compiler.generateProgram(program, config);
		if (secureJit) {
			compiler.enableExecution();
		}
		mem.memory = datasetPtr->memory + datasetOffset;
		execute();
	}